

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-vfp.inc.c
# Opt level: O3

_Bool trans_VCVT_sp(DisasContext_conflict1 *s,arg_VCVT_sp *a)

{
  TCGContext_conflict1 *s_00;
  _Bool _Var1;
  TCGTemp *ts;
  TCGTemp *ret;
  _Bool _Var2;
  uint uVar3;
  TCGTemp *local_48;
  TCGv_ptr local_40;
  
  uVar3 = s->isar->mvfr0;
  if (((uVar3 & 0xf00) == 0) ||
     ((s_00 = s->uc->tcg_ctx, (uVar3 & 0xe) == 0 && ((a->vd & 0x10) != 0)))) {
    _Var2 = false;
  }
  else {
    _Var1 = full_vfp_access_check(s,false);
    _Var2 = true;
    if (_Var1) {
      ts = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
      ret = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
      uVar3 = a->vm << 2;
      tcg_gen_op3_aarch64(s_00,INDEX_op_ld_i32,(TCGArg)ts,(TCGArg)(s_00->cpu_env + (long)s_00),
                          ((ulong)(uVar3 & 4) | (ulong)(uVar3 & 8) | (ulong)((uint)a->vm >> 2) << 8)
                          + 0xc10);
      local_40 = s_00->cpu_env + (long)s_00;
      local_48 = ts;
      tcg_gen_callN_aarch64(s_00,helper_vfp_fcvtds_aarch64,ret,2,&local_48);
      tcg_gen_op3_aarch64(s_00,INDEX_op_st_i64,(TCGArg)ret,(TCGArg)(s_00->cpu_env + (long)s_00),
                          (ulong)((uint)a->vd >> 1) * 0x100 + (ulong)(a->vd & 1) * 8 + 0xc10);
      tcg_temp_free_internal_aarch64(s_00,ts);
      tcg_temp_free_internal_aarch64(s_00,ret);
    }
  }
  return _Var2;
}

Assistant:

static bool trans_VCVT_sp(DisasContext *s, arg_VCVT_sp *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i64 vd;
    TCGv_i32 vm;

    if (!dc_isar_feature(aa32_fpdp_v2, s)) {
        return false;
    }

    /* UNDEF accesses to D16-D31 if they don't exist. */
    if (!dc_isar_feature(aa32_simd_r32, s) && (a->vd & 0x10)) {
        return false;
    }

    if (!vfp_access_check(s)) {
        return true;
    }

    vm = tcg_temp_new_i32(tcg_ctx);
    vd = tcg_temp_new_i64(tcg_ctx);
    neon_load_reg32(tcg_ctx, vm, a->vm);
    gen_helper_vfp_fcvtds(tcg_ctx, vd, vm, tcg_ctx->cpu_env);
    neon_store_reg64(tcg_ctx, vd, a->vd);
    tcg_temp_free_i32(tcg_ctx, vm);
    tcg_temp_free_i64(tcg_ctx, vd);
    return true;
}